

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_stream.cc
# Opt level: O3

int __thiscall google::protobuf::io::GzipOutputStream::Deflate(GzipOutputStream *this,int flush)

{
  void **ppvVar1;
  int *piVar2;
  uint uVar3;
  uInt uVar4;
  Bytef *pBVar5;
  ulong uVar6;
  int iVar7;
  uInt *extraout_RDX;
  ulong uVar8;
  undefined8 *puVar9;
  GzipOutputStream *this_00;
  bool bVar10;
  LogMessageDebugFatal aLStack_78 [16];
  void **ppvStack_68;
  int *piStack_60;
  GzipOutputStream *pGStack_58;
  ulong uStack_50;
  undefined8 local_40 [2];
  
  uVar6 = (ulong)(uint)flush;
  ppvVar1 = &this->sub_data_;
  piVar2 = &this->sub_data_size_;
  bVar10 = (this->zcontext_).avail_out == 0;
  do {
    if ((*ppvVar1 == (void *)0x0) || (bVar10)) {
      uStack_50 = 0x2a65dc;
      iVar7 = (*this->sub_stream_->_vptr_ZeroCopyOutputStream[2])(this->sub_stream_,ppvVar1,piVar2);
      if ((char)iVar7 == '\0') {
        iVar7 = -5;
        goto LAB_002a6627;
      }
      uVar3 = *piVar2;
      this_00 = (GzipOutputStream *)(ulong)uVar3;
      if ((int)uVar3 < 1) {
        puVar9 = local_40;
        uStack_50 = 0x2a6651;
        Deflate();
        if ((this_00->zerror_ != 0) && (this_00->zerror_ != -5)) {
          return 0;
        }
        uVar8 = uVar6;
        if ((this_00->zcontext_).avail_in != 0) {
          uVar8 = 0;
          ppvStack_68 = ppvVar1;
          piStack_60 = piVar2;
          pGStack_58 = this;
          uStack_50 = uVar6;
          iVar7 = Deflate(this_00,0);
          this_00->zerror_ = iVar7;
          if (iVar7 != 0) {
            return 0;
          }
          if ((this_00->zcontext_).avail_in != 0) {
            absl::lts_20240722::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                      (aLStack_78,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/gzip_stream.cc"
                       ,0x113);
            absl::lts_20240722::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                      (aLStack_78,0x1d,"Deflate left bytes unconsumed");
            absl::lts_20240722::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
                      (aLStack_78);
            goto LAB_002a66b4;
          }
        }
        pBVar5 = (Bytef *)this_00->input_buffer_;
        (this_00->zcontext_).next_in = pBVar5;
        uVar4 = (uInt)this_00->input_buffer_length_;
        (this_00->zcontext_).avail_in = uVar4;
        *puVar9 = pBVar5;
        *extraout_RDX = uVar4;
LAB_002a66b4:
        return (int)CONCAT71((int7)(uVar8 >> 8),1);
      }
      (this->zcontext_).next_out = (Bytef *)this->sub_data_;
      (this->zcontext_).avail_out = uVar3;
    }
    uStack_50 = 0x2a65fd;
    iVar7 = deflate(&this->zcontext_,uVar6);
    bVar10 = true;
  } while (iVar7 == 0 && (this->zcontext_).avail_out == 0);
  if (flush - 3U < 2) {
    uStack_50 = 0x2a661f;
    (*this->sub_stream_->_vptr_ZeroCopyOutputStream[3])();
LAB_002a6627:
    *ppvVar1 = (void *)0x0;
    *piVar2 = 0;
  }
  return iVar7;
}

Assistant:

int GzipOutputStream::Deflate(int flush) {
  int error = Z_OK;
  do {
    if ((sub_data_ == NULL) || (zcontext_.avail_out == 0)) {
      bool ok = sub_stream_->Next(&sub_data_, &sub_data_size_);
      if (!ok) {
        sub_data_ = NULL;
        sub_data_size_ = 0;
        return Z_BUF_ERROR;
      }
      ABSL_CHECK_GT(sub_data_size_, 0);
      zcontext_.next_out = static_cast<Bytef*>(sub_data_);
      zcontext_.avail_out = sub_data_size_;
    }
    error = deflate(&zcontext_, flush);
  } while (error == Z_OK && zcontext_.avail_out == 0);
  if ((flush == Z_FULL_FLUSH) || (flush == Z_FINISH)) {
    // Notify lower layer of data.
    sub_stream_->BackUp(zcontext_.avail_out);
    // We don't own the buffer anymore.
    sub_data_ = NULL;
    sub_data_size_ = 0;
  }
  return error;
}